

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void P_RipperBlood(AActor *mo,AActor *bleeder)

{
  byte *pbVar1;
  uint kind;
  int iVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *pAVar14;
  DVector2 v;
  DVector3 local_58;
  _func_int **local_40;
  DAngle local_38;
  PClass *pPVar13;
  
  pPVar13 = (bleeder->super_DThinker).super_DObject.Class;
  if (pPVar13 == (PClass *)0x0) {
    iVar6 = (**(bleeder->super_DThinker).super_DObject._vptr_DObject)(bleeder);
    pPVar13 = (PClass *)CONCAT44(extraout_var,iVar6);
    (bleeder->super_DThinker).super_DObject.Class = pPVar13;
  }
  kind = *(uint *)&pPVar13[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                   VisitNext;
  type = AActor::GetBloodType(bleeder,0);
  uVar7 = FRandom::GenRand32(&pr_ripperblood);
  uVar8 = FRandom::GenRand32(&pr_ripperblood);
  uVar9 = FRandom::GenRand32(&pr_ripperblood);
  uVar10 = FRandom::GenRand32(&pr_ripperblood);
  uVar11 = FRandom::GenRand32(&pr_ripperblood);
  uVar12 = FRandom::GenRand32(&pr_ripperblood);
  P_GetOffsetPosition((mo->__Pos).X,(mo->__Pos).Y,
                      (double)(int)((uVar7 & 0xff) - (uVar8 & 0xff)) * 0.0625,
                      (double)(int)((uVar9 & 0xff) - (uVar10 & 0xff)) * 0.0625);
  iVar6 = cl_bloodtype.Value;
  local_58.Z = (double)(int)((uVar11 & 0xff) - (uVar12 & 0xff)) * 0.0625 + (mo->__Pos).Z;
  uVar7 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    iVar2 = *(int *)((type->super_PClass).Defaults + 0x198);
    pAVar14 = AActor::StaticSpawn(type,&local_58,NO_REPLACE,false);
    if (((pAVar14->flags5).Value & 0x800000) != 0) {
      (pAVar14->target).field_0.p = bleeder;
    }
    if (gameinfo.gametype == GAME_Heretic) {
      pbVar1 = (byte *)((long)&(pAVar14->flags).Value + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    uVar7 = (iVar2 << 4) >> 0x1f & iVar6;
    dVar4 = (mo->Vel).X * 0.5;
    dVar5 = (mo->Vel).Y * 0.5;
    auVar3._8_4_ = SUB84(dVar5,0);
    auVar3._0_8_ = dVar4;
    auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
    (pAVar14->Vel).X = dVar4;
    (pAVar14->Vel).Y = (double)auVar3._8_8_;
    uVar8 = FRandom::GenRand32(&pr_ripperblood);
    pAVar14->tics = pAVar14->tics + (uVar8 & 3);
    if ((kind != 0) && (((pAVar14->flags2).Value & 0x10000) == 0)) {
      pAVar14->Translation = kind >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar7) {
      pbVar1 = (byte *)((long)&(pAVar14->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_00554228;
    }
  }
  if ((int)uVar7 < 1) {
    return;
  }
LAB_00554228:
  AActor::AngleTo((AActor *)&stack0xffffffffffffffc0,bleeder,SUB81(mo,0));
  local_38.Degrees = (double)local_40 + 180.0;
  P_DrawSplash2(0x1c,&local_58,&stack0xffffffffffffffc8,0,kind);
  return;
}

Assistant:

void P_RipperBlood (AActor *mo, AActor *bleeder)
{
	PalEntry bloodcolor = bleeder->GetBloodColor();
	PClassActor *bloodcls = bleeder->GetBloodType();

	double xo = pr_ripperblood.Random2() / 16.;
	double yo = pr_ripperblood.Random2() / 16.;
	double zo = pr_ripperblood.Random2() / 16.;
	DVector3 pos = mo->Vec3Offset(xo, yo, zo);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		AActor *th;
		th = Spawn (bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = bleeder;
		if (gameinfo.gametype == GAME_Heretic)
			th->flags |= MF_NOGRAVITY;
		th->Vel.X = mo->Vel.X / 2;
		th->Vel.Y = mo->Vel.Y / 2;
		th->tics += pr_ripperblood () & 3;

		// colorize the blood!
		if (bloodcolor!=0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(28, pos, bleeder->AngleTo(mo) + 180., 0, bloodcolor);
	}
}